

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeCTRAW.cpp
# Opt level: O2

int __thiscall
FormatTypeCTRAW::LoadDisk
          (FormatTypeCTRAW *this,uchar *buffer,size_t size,IDisk **created_disk,
          ILoadingProgress *loading_progress)

{
  int iVar1;
  IDisk *this_00;
  CAPSFile caps_file;
  
  if (*(int *)buffer == 0x53504143) {
    CAPSFile::CAPSFile(&caps_file);
    this_00 = (IDisk *)operator_new(0x68);
    IDisk::IDisk(this_00);
    *created_disk = this_00;
    iVar1 = CAPSFile::ReadBuffer(&caps_file,buffer,(uint)size,this_00,loading_progress);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      if (*created_disk != (IDisk *)0x0) {
        (*(*created_disk)->_vptr_IDisk[1])();
      }
      *created_disk = (IDisk *)0x0;
      iVar1 = -1;
    }
    CAPSFile::~CAPSFile(&caps_file);
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int FormatTypeCTRAW::LoadDisk(const unsigned char* buffer, size_t size, IDisk*& created_disk,
                              ILoadingProgress* loading_progress)
{
   if (memcmp(buffer, "CAPS", 4) == 0)
   {
      CAPSFile caps_file;
      created_disk = new IDisk();
      if (caps_file.ReadBuffer(buffer, size, created_disk, loading_progress) == 0)
      {
         return OK;
      }
      else
      {
         delete created_disk;
         created_disk = nullptr;
         return FILE_ERROR;
      }
   }
   else
   {
      return FILE_ERROR;
   }
}